

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O1

bool __thiscall slang::ast::AssertionExpr::admitsEmpty(AssertionExpr *this)

{
  bool bVar1;
  AdmitsEmpty AVar2;
  logic_error *this_00;
  long *plVar3;
  size_type *psVar4;
  long *plVar5;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  do {
    switch(((AssertionExpr *)&((Expression *)this)->kind)->kind) {
    case Invalid:
    case Unary:
    case StrongWeak:
    case Abort:
    case Conditional:
    case Case:
    case DisableIff:
      return false;
    case Simple:
      bVar1 = SimpleAssertionExpr::admitsEmptyImpl((SimpleAssertionExpr *)this);
      return bVar1;
    case SequenceConcat:
      bVar1 = SequenceConcatExpr::admitsEmptyImpl((SequenceConcatExpr *)this);
      return bVar1;
    case SequenceWithMatch:
      if (*(char *)&(((Expression *)this)->sourceRange).endLoc != '\x01') {
        return false;
      }
      AVar2 = SequenceRepetition::admitsEmpty((SequenceRepetition *)&((Expression *)this)->syntax);
      if (AVar2 != Yes) {
        return false;
      }
      return true;
    case Binary:
      bVar1 = BinaryAssertionExpr::admitsEmptyImpl((BinaryAssertionExpr *)this);
      return bVar1;
    case FirstMatch:
      if (*(long *)&((Expression *)this)->sourceRange != 0) {
        return false;
      }
      this = (AssertionExpr *)((Expression *)this)->constant;
      break;
    case Clocking:
      this = (AssertionExpr *)((Expression *)this)->syntax;
      break;
    default:
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      local_90[0] = local_80;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_90,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/ASTVisitor.h"
                 ,"");
      plVar3 = (long *)std::__cxx11::string::append((char *)local_90);
      local_d0._M_dataplus._M_p = (pointer)*plVar3;
      psVar4 = (size_type *)(plVar3 + 2);
      if ((size_type *)local_d0._M_dataplus._M_p == psVar4) {
        local_d0.field_2._M_allocated_capacity = *psVar4;
        local_d0.field_2._8_8_ = plVar3[3];
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *psVar4;
      }
      local_d0._M_string_length = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::to_string(&local_70,0x199);
      std::operator+(&local_50,&local_d0,&local_70);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_b0 = (long *)*plVar3;
      plVar5 = plVar3 + 2;
      if (local_b0 == plVar5) {
        local_a0 = *plVar5;
        lStack_98 = plVar3[3];
        local_b0 = &local_a0;
      }
      else {
        local_a0 = *plVar5;
      }
      local_a8 = plVar3[1];
      *plVar3 = (long)plVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_b0);
      local_f0 = (long *)*plVar3;
      plVar5 = plVar3 + 2;
      if (local_f0 == plVar5) {
        local_e0 = *plVar5;
        lStack_d8 = plVar3[3];
        local_f0 = &local_e0;
      }
      else {
        local_e0 = *plVar5;
      }
      local_e8 = plVar3[1];
      *plVar3 = (long)plVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::logic_error::logic_error(this_00,(string *)&local_f0);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
  } while( true );
}

Assistant:

bool AssertionExpr::admitsEmpty() const {
    AdmitsEmptyVisitor visitor;
    return visit(visitor);
}